

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.c
# Opt level: O3

int testGetFullTerritoryNameLocal(char *expectedName,Territory territory,int alternative)

{
  char cVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  char *pcVar6;
  char s [8];
  char gotName [112];
  char local_b0 [8];
  char local_a8 [120];
  ulong uVar5;
  
  cVar1 = *expectedName;
  uVar2 = getFullTerritoryNameLocalUtf8(local_a8,territory,alternative);
  uVar5 = (ulong)uVar2;
  if (cVar1 != '\0') {
    uVar3 = strcmp(expectedName,local_a8);
    uVar5 = (ulong)uVar3;
    if (uVar3 != 0) {
      pthread_mutex_lock((pthread_mutex_t *)&mutex);
      nrErrors = nrErrors + 1;
      pthread_mutex_unlock((pthread_mutex_t *)&mutex);
      pcVar6 = getTerritoryIsoName(local_b0,territory,0);
      uVar3 = printf("*** ERROR *** getFullTerritoryNameLocal error, expected name \'%s\', but got \'%s\' for territory %s, alternative %d\n"
                     ,expectedName,local_a8,pcVar6,(ulong)(uint)alternative);
      uVar5 = (ulong)uVar3;
    }
  }
  iVar4 = (int)CONCAT71((int7)(uVar5 >> 8),cVar1 != '\0');
  if ((cVar1 != '\0') != (uVar2 != 0)) {
    pthread_mutex_lock((pthread_mutex_t *)&mutex);
    nrErrors = nrErrors + 1;
    pthread_mutex_unlock((pthread_mutex_t *)&mutex);
    pcVar6 = getTerritoryIsoName(local_b0,territory,0);
    iVar4 = printf("*** ERROR *** getFullTerritoryNameLocal error, expected return code %d, but got %d (%s) for territory %s, alternative %d\n"
                   ,(ulong)(cVar1 != '\0'),(ulong)uVar2,local_a8,pcVar6,(ulong)(uint)alternative);
  }
  return iVar4;
}

Assistant:

static int testGetFullTerritoryNameLocal(const char *expectedName, enum Territory territory, int alternative) {
    int nrTests = 0;
    int expectedCode = (*expectedName ? 1 : 0);
    char gotName[MAX_TERRITORY_FULLNAME_UTF8_LEN + 1];
    int gotCode = getFullTerritoryNameLocalUtf8(gotName, territory, alternative);
    ++nrTests;
    if (expectedCode && strcmp(expectedName, gotName)) {
        char s[MAX_ISOCODE_ASCII_LEN + 1];
        foundError();
        printf("*** ERROR *** getFullTerritoryNameLocal error, expected name '%s', but got '%s' for territory %s, alternative %d\n",
               expectedName, gotName, getTerritoryIsoName(s, territory, 0), alternative);
    }
    ++nrTests;
    if ((expectedCode && !gotCode) || (!expectedCode && gotCode)) {
        char s[MAX_ISOCODE_ASCII_LEN + 1];
        foundError();
        printf("*** ERROR *** getFullTerritoryNameLocal error, expected return code %d, but got %d (%s) for territory %s, alternative %d\n",
               expectedCode, gotCode, gotName, getTerritoryIsoName(s, territory, 0), alternative);
    }
    return nrTests;
}